

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

void __thiscall soul::Value::Value(Value *this,complex<float> v)

{
  PackedData local_58;
  Type local_30;
  Value *local_18;
  Value *this_local;
  complex<float> v_local;
  
  local_18 = this;
  Type::Type(&local_30,complex32);
  Value(this,&local_30);
  Type::~Type(&local_30);
  getData(&local_58,this);
  PackedData::setAs<std::complex<float>>(&local_58,(complex<float>)this);
  return;
}

Assistant:

Value::Value (std::complex<float> v)  : Value (Type (PrimitiveType::complex32))   { getData().setAs (v); }